

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O2

void ly_err_print_build_path(ly_ctx *ctx,lyd_node *node,lysc_node *scnode,ly_err_item *eitem)

{
  LY_VECODE code;
  uint32_t dnode_steps;
  lyd_node *dnode;
  uint32_t scnode_steps;
  lysc_node *scnode_00;
  
  if (((eitem->data_path != (char *)0x0) || (eitem->schema_path != (char *)0x0)) ||
     (eitem->line != 0)) {
    ly_err_print(ctx,eitem);
    return;
  }
  if (node == (lyd_node *)0x0) {
    if (scnode == (lysc_node *)0x0) goto LAB_00125e46;
    dnode = (lyd_node *)0x0;
    scnode_00 = scnode;
  }
  else {
    dnode = node;
    scnode_00 = (lysc_node *)0x0;
  }
  ly_log_location(scnode_00,dnode,(char *)0x0,(ly_in *)0x0);
LAB_00125e46:
  if (eitem->err == LY_EVALID) {
    code = eitem->vecode;
  }
  else {
    code = LYVE_DATA;
  }
  ly_vlog(ctx,eitem->apptag,code,"%s",eitem->msg);
  if (node == (lyd_node *)0x0) {
    if (scnode == (lysc_node *)0x0) {
      return;
    }
    scnode_steps = 1;
    dnode_steps = 0;
  }
  else {
    dnode_steps = 1;
    scnode_steps = 0;
  }
  ly_log_location_revert(scnode_steps,dnode_steps,0,0);
  return;
}

Assistant:

static void
ly_err_print_build_path(const struct ly_ctx *ctx, const struct lyd_node *node, const struct lysc_node *scnode,
        struct ly_err_item *eitem)
{
    if (eitem->data_path || eitem->schema_path || eitem->line) {
        ly_err_print(ctx, eitem);
    } else {
        if (node) {
            LOG_LOCSET(NULL, node);
        } else if (scnode) {
            LOG_LOCSET(scnode, NULL);
        }
        ly_vlog(ctx, eitem->apptag, eitem->err == LY_EVALID ? eitem->vecode : LYVE_DATA, "%s", eitem->msg);
        if (node) {
            LOG_LOCBACK(0, 1);
        } else if (scnode) {
            LOG_LOCBACK(1, 0);
        }
    }
}